

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nam.cpp
# Opt level: O0

bool mg::data::nam_read(string *data,Nam *out)

{
  ulong uVar1;
  ulong uVar2;
  bool bVar3;
  char *local_38;
  char *str;
  ulong uStack_28;
  int len;
  size_type read_offset;
  Nam *out_local;
  string *data_local;
  
  read_offset = (size_type)out;
  out_local = (Nam *)data;
  uVar1 = std::__cxx11::string::size();
  if ((uVar1 & 0x1f) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)read_offset);
    uStack_28 = 0;
    while( true ) {
      uVar1 = uStack_28;
      uVar2 = std::__cxx11::string::size();
      if (uVar2 <= uVar1) break;
      str._4_4_ = 0;
      local_38 = (char *)std::__cxx11::string::operator[]((ulong)out_local);
      while( true ) {
        bVar3 = false;
        if ((str._4_4_ < 0x20) && (bVar3 = false, local_38[str._4_4_] != '\0')) {
          bVar3 = false;
          if (local_38[str._4_4_] == '\r') {
            bVar3 = local_38[str._4_4_ + 1] == '\n';
          }
          bVar3 = (bool)(bVar3 ^ 1);
        }
        if (!bVar3) break;
        str._4_4_ = str._4_4_ + 1;
      }
      if (str._4_4_ != 0) {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<char_const*&,int&>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)read_offset,
                   &local_38,(int *)((long)&str + 4));
      }
      uStack_28 = uStack_28 + 0x20;
    }
    data_local._7_1_ = true;
  }
  else {
    fprintf(_stderr,"Wrong size for NAM data file\n");
    data_local._7_1_ = false;
  }
  return data_local._7_1_;
}

Assistant:

bool nam_read(const std::string &data, Nam &out) {
  // If this file isn't aligned to MAX_STRLEN byte entries, it might not be a
  // NAM
  if (data.size() % Nam::MAX_STRLEN != 0) {
    fprintf(stderr, "Wrong size for NAM data file\n");
    return false;
  }

  // Clear output
  out.names.clear();

  // Iterate each record and add
  std::string::size_type read_offset = 0;
  while (read_offset < data.size()) {
    // Read up to nul byte, max strlen or \r\n
    int len = 0;
    const char *str = &data[read_offset];
    for (; len < Nam::MAX_STRLEN && str[len] != '\0' &&
           !(str[len] == '\r' && str[len + 1] == '\n');
         len++) {
    }
    if (len != 0) {
      out.names.emplace_back(str, len);
    }

    read_offset += Nam::MAX_STRLEN;
  }

  return true;
}